

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O2

_Bool content_type_match(char *contenttype,char *target,size_t len)

{
  byte bVar1;
  int iVar2;
  
  if (contenttype == (char *)0x0) {
    bVar1 = 0;
  }
  else {
    iVar2 = curl_strnequal(contenttype,target,len);
    if ((iVar2 == 0) || (0x3b < (byte)contenttype[len])) {
      bVar1 = 0;
    }
    else {
      bVar1 = (byte)(0x800000100002601 >> (contenttype[len] & 0x3fU));
    }
  }
  return (_Bool)(bVar1 & 1);
}

Assistant:

static bool content_type_match(const char *contenttype,
                               const char *target, size_t len)
{
  if(contenttype && strncasecompare(contenttype, target, len))
    switch(contenttype[len]) {
    case '\0':
    case '\t':
    case '\r':
    case '\n':
    case ' ':
    case ';':
      return TRUE;
    }
  return FALSE;
}